

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdReplace<wabt::interp::Simd<float,(unsigned_char)4>,float>
          (Thread *this,Instr instr)

{
  float fVar1;
  float *pfVar2;
  Simd<float,_(unsigned_char)__x04_> SVar3;
  undefined1 auStack_24 [8];
  Simd<float,_(unsigned_char)__x04_> simd;
  float val;
  Thread *this_local;
  
  unique0x100000fc = this;
  simd.v[2] = Pop<float>(this);
  SVar3 = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  fVar1 = simd.v[2];
  simd.v._0_8_ = SVar3.v._8_8_;
  auStack_24 = SVar3.v._0_8_;
  pfVar2 = Simd<float,_(unsigned_char)'\x04'>::operator[]
                     ((Simd<float,_(unsigned_char)__x04_> *)auStack_24,instr.field_2.imm_u8);
  *pfVar2 = fVar1;
  SVar3.v[2] = simd.v[0];
  SVar3.v[3] = simd.v[1];
  SVar3.v[0] = (float)auStack_24._0_4_;
  SVar3.v[1] = (float)auStack_24._4_4_;
  Push<wabt::interp::Simd<float,(unsigned_char)4>>(this,SVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdReplace(Instr instr) {
  auto val = Pop<T>();
  auto simd = Pop<R>();
  simd[instr.imm_u8] = val;
  Push(simd);
  return RunResult::Ok;
}